

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  Type TVar5;
  EnumValueDescriptor *pEVar6;
  LogMessage *pLVar7;
  ulong uVar8;
  long *plVar9;
  undefined8 *puVar10;
  ushort uVar11;
  size_type *psVar12;
  ulong *puVar13;
  ushort uVar14;
  int i;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar15;
  FieldDescriptor *field_00;
  long i_00;
  FieldDescriptor *field_01;
  long lVar16;
  ushort uVar17;
  undefined8 uVar18;
  char *pcVar19;
  char cVar20;
  _Alloc_hider _Var21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  string result;
  string out;
  allocator local_9a;
  LogFinisher local_99;
  string local_98;
  string local_78;
  Printer *local_58;
  string local_50;
  
  TVar5 = FieldDescriptor::type(field);
  bVar25 = true;
  pFVar15 = extraout_RDX;
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) != 6) {
    TVar5 = FieldDescriptor::type(field);
    bVar25 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 5;
    pFVar15 = extraout_RDX_00;
  }
  if (!use_default) {
    if (bVar25) {
      iVar2 = *(int *)(field + 0x4c);
      if (iVar2 == 2) {
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&result,(_anonymous_namespace_ *)field,pFVar15);
        std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_78);
        io::Printer::Print(printer,"+jspb.Message.getField($obj$, $index$)","index",&result,"obj",
                           &out);
        goto LAB_00223685;
      }
      pcVar19 = "GPBFieldOptional";
      if (iVar2 == 3) {
        pcVar19 = "GPBFieldRepeated";
      }
      pcVar4 = "GPBFieldOptional";
      if (iVar2 == 3) {
        pcVar4 = "GPBFieldRepeated";
      }
      result._M_dataplus._M_p = (pointer)&result.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,pcVar19 + 8,pcVar4 + 0x10);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&out,(_anonymous_namespace_ *)field,field_01);
      std::__cxx11::string::string((string *)&local_78,obj_reference,(allocator *)&local_50);
      io::Printer::Print(printer,"jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
                         "cardinality",&result,"index",&out,"obj",&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,
                        CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]
                                ) + 1);
      }
      local_78.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = result._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p == &result.field_2) {
        return;
      }
    }
    else {
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&result,(_anonymous_namespace_ *)field,pFVar15)
      ;
      std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_78);
      io::Printer::Print(printer,"jspb.Message.getField($obj$, $index$)","index",&result,"obj",&out)
      ;
LAB_00223685:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) {
        operator_delete(out._M_dataplus._M_p,
                        CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]
                                ) + 1);
      }
      local_78.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = result._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p == &result.field_2) {
        return;
      }
    }
    goto LAB_00223a14;
  }
  if (bVar25) {
    io::Printer::Print(printer,"+");
  }
  std::__cxx11::string::string((string *)&local_78,obj_reference,&local_9a);
  pFVar15 = field;
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&local_50,(_anonymous_namespace_ *)field,field_00);
  if (*(int *)(field + 0x4c) == 3) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 2;
    local_98.field_2._M_allocated_capacity._0_3_ = 0x5d5b;
    goto LAB_0022397f;
  }
  TVar5 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 2:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 3:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 4:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(&result,(protobuf *)pFVar15,*(double *)(field + 0xa0));
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
    goto LAB_0022394d;
  case 6:
    SimpleFtoa_abi_cxx11_(&result,(protobuf *)pFVar15,*(float *)(field + 0xa0));
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
LAB_0022394d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,
                      CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0])
                      + 1);
    }
    break;
  case 7:
    pcVar19 = "false";
    if ((ulong)(byte)field[0xa0] != 0) {
      pcVar19 = "true";
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pcVar19,pcVar19 + ((ulong)(byte)field[0xa0] ^ 5));
    goto LAB_0022397f;
  case 8:
    pEVar6 = FieldDescriptor::default_value_enum(field);
    SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)*(uint *)(pEVar6 + 0x10),i);
    goto LAB_0022397f;
  case 9:
    TVar5 = FieldDescriptor::type(field);
    if (TVar5 == TYPE_STRING) {
      out._M_dataplus._M_p = (pointer)&out.field_2;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      plVar9 = *(long **)(field + 0xa0);
      uVar24 = plVar9[1];
      bVar25 = uVar24 == 0;
      if (!bVar25) {
        bVar25 = false;
        uVar23 = 0;
        uVar8 = 0;
        do {
          lVar3 = *plVar9;
          if (uVar23 + 1 < uVar24) {
            uVar14 = *(byte *)(lVar3 + uVar23 + 1) & 0x3f;
          }
          else {
            uVar14 = 0;
          }
          if (uVar23 + 2 < uVar24) {
            uVar17 = *(byte *)(lVar3 + uVar23 + 2) & 0x3f;
          }
          else {
            uVar17 = 0;
          }
          uVar24 = uVar24 - uVar23;
          uVar22 = uVar24;
          if (uVar24 == 0) {
LAB_00223b76:
            uVar11 = 0;
          }
          else {
            bVar1 = *(byte *)(lVar3 + uVar23);
            uVar11 = (ushort)bVar1;
            uVar22 = 1;
            if (((((char)bVar1 < '\0') && (uVar22 = 2, (bVar1 & 0xe0) != 0xc0)) &&
                (uVar22 = 3, (bVar1 & 0xf0) != 0xe0)) || (uVar24 < uVar22)) {
              uVar22 = 0;
              goto LAB_00223b76;
            }
            if ((int)uVar22 == 3) {
              uVar11 = uVar17 | uVar14 << 6 | (ushort)bVar1 << 0xc;
            }
            else if ((int)uVar22 == 2) {
              uVar11 = uVar14 | (bVar1 & 0x1f) << 6;
            }
          }
          if (uVar22 != 0) {
            uVar8 = uVar22;
            if (uVar11 < 0x26) {
              switch(uVar11) {
              case 8:
                break;
              case 9:
                break;
              case 10:
                break;
              case 0xb:
switchD_00223bd1_caseD_b:
                if ((ushort)(uVar11 - 0x20) < 0x5f) {
                  std::__cxx11::string::push_back((char)&out);
                }
                else {
                  if (uVar11 < 0x100) {
                    StringPrintf_abi_cxx11_(&result,"\\x%02x");
                    std::__cxx11::string::_M_append((char *)&out,(ulong)result._M_dataplus._M_p);
                  }
                  else {
                    StringPrintf_abi_cxx11_(&result,"\\u%04x");
                    std::__cxx11::string::_M_append((char *)&out,(ulong)result._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._M_dataplus._M_p != &result.field_2) {
                    operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1
                                   );
                  }
                }
                goto LAB_00223c96;
              case 0xc:
                break;
              case 0xd:
                break;
              default:
                if (uVar11 != 0x22) goto switchD_00223bd1_caseD_b;
              }
            }
            else if (uVar11 < 0x3d) {
              if (((uVar11 != 0x26) && (uVar11 != 0x27)) && (uVar11 != 0x3c))
              goto switchD_00223bd1_caseD_b;
            }
            else if (((uVar11 != 0x3d) && (uVar11 != 0x3e)) && (uVar11 != 0x5c))
            goto switchD_00223bd1_caseD_b;
            std::__cxx11::string::append((char *)&out);
          }
LAB_00223c96:
          if (uVar22 == 0) break;
          uVar23 = uVar23 + uVar8;
          uVar24 = plVar9[1];
          bVar25 = uVar23 >= uVar24;
        } while (uVar23 < uVar24);
      }
      if (!bVar25) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&result,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                   ,799);
        pLVar7 = internal::LogMessage::operator<<
                           ((LogMessage *)&result,"The default value for field ");
        pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(field + 8));
        pLVar7 = internal::LogMessage::operator<<
                           (pLVar7,
                            " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                           );
        internal::LogFinisher::operator=(&local_99,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)&result);
      }
      std::operator+(&result,"\"",&out);
      plVar9 = (long *)std::__cxx11::string::append((char *)&result);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      puVar13 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_98.field_2._M_allocated_capacity = *puVar13;
        local_98.field_2._8_8_ = plVar9[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *puVar13;
        local_98._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_98._M_string_length = plVar9[1];
      *plVar9 = (long)puVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
LAB_00223f4d:
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      lVar3 = *(long *)(field + 0xa0);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      local_58 = printer;
      if (*(long *)(lVar3 + 8) != 0) {
        lVar16 = 2;
        do {
          cVar20 = (char)&out;
          std::__cxx11::string::push_back(cVar20);
          std::__cxx11::string::push_back(cVar20);
          std::__cxx11::string::push_back(cVar20);
          std::__cxx11::string::push_back(cVar20);
          uVar24 = lVar16 + 1;
          lVar16 = lVar16 + 3;
        } while (uVar24 < *(ulong *)(lVar3 + 8));
      }
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&out,0,(char *)0x0,0x356813);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar12) {
        result.field_2._M_allocated_capacity = *psVar12;
        result.field_2._8_8_ = plVar9[3];
        result._M_dataplus._M_p = (pointer)&result.field_2;
      }
      else {
        result.field_2._M_allocated_capacity = *psVar12;
        result._M_dataplus._M_p = (pointer)*plVar9;
      }
      result._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&result);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      puVar13 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_98.field_2._M_allocated_capacity = *puVar13;
        local_98.field_2._8_8_ = puVar10[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *puVar13;
        local_98._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_98._M_string_length = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      printer = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) goto LAB_00223f4d;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p == &out.field_2) goto LAB_0022397f;
    uVar18 = CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
    _Var21._M_p = out._M_dataplus._M_p;
    goto LAB_00223977;
  case 10:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 4;
    local_98.field_2._M_allocated_capacity._0_5_ = 0x6c6c756e;
    goto LAB_0022397f;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&result,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x32a);
    pLVar7 = internal::LogMessage::operator<<((LogMessage *)&result,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&out,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)&result);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_0022397f;
  }
  uVar18 = result.field_2._M_allocated_capacity;
  _Var21._M_p = result._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
LAB_00223977:
    operator_delete(_Var21._M_p,uVar18 + 1);
  }
LAB_0022397f:
  io::Printer::Print(printer,"jspb.Message.getFieldWithDefault($obj$, $index$, $default$)","obj",
                     &local_78,"index",&local_50,"default",&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_00223a14:
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char *obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  if (use_default) {
    if (is_float_or_double) {
      // Coerce "Nan" and "Infinity" to actual float values.
      //
      // This will change null to 0, but that doesn't matter since we're getting
      // with a default.
      printer->Print("+");
    }

    printer->Print(
        "jspb.Message.getFieldWithDefault($obj$, $index$, $default$)",
        "obj", obj_reference,
        "index", JSFieldIndex(field),
        "default", JSFieldDefault(field));
  } else {
    if (is_float_or_double) {
      if (field->is_required()) {
        // Use "+" to convert all fields to numeric (including null).
        printer->Print(
            "+jspb.Message.getField($obj$, $index$)",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      } else {
        // Converts "NaN" and "Infinity" while preserving null.
        printer->Print(
            "jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
            "cardinality", field->is_repeated() ? "Repeated" : "Optional",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      }
    } else {
      printer->Print("jspb.Message.getField($obj$, $index$)",
                     "index", JSFieldIndex(field),
                     "obj", obj_reference);
    }
  }
}